

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogListView::keyPressEvent(QFileDialogListView *this,QKeyEvent *e)

{
  bool bVar1;
  socklen_t *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int __fd;
  QEvent *in_RSI;
  QKeyEvent *unaff_retaddr;
  QKeyEvent *in_stack_00000088;
  QAbstractItemView *in_stack_00000090;
  
  __fd = (int)in_RSI;
  bVar1 = QFileDialogPrivate::itemViewKeyboardEvent((QFileDialogPrivate *)e,unaff_retaddr);
  __addr = extraout_RDX;
  if (!bVar1) {
    __fd = (int)in_RSI;
    QAbstractItemView::keyPressEvent(in_stack_00000090,in_stack_00000088);
    __addr = extraout_RDX_00;
  }
  QEvent::accept(in_RSI,__fd,__addr,in_RCX);
  return;
}

Assistant:

void QFileDialogListView::keyPressEvent(QKeyEvent *e)
{
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional) {
        QListView::keyPressEvent(e);
        return;
    }
#endif // QT_KEYPAD_NAVIGATION

    if (!d_ptr->itemViewKeyboardEvent(e))
        QListView::keyPressEvent(e);
    e->accept();
}